

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.h
# Opt level: O1

void __thiscall HuffmanEncoder::HuffmanEncoder(HuffmanEncoder *this,string *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  pointer pcVar3;
  char *local_38;
  size_type local_30;
  char local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  pcVar3 = (message->_M_dataplus)._M_p;
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar3,pcVar3 + message->_M_string_length);
  (this->super_Cryptor)._vptr_Cryptor = (_func_int **)&PTR__Cryptor_0010fae8;
  paVar1 = &(this->super_Cryptor).in_message_.field_2;
  (this->super_Cryptor).in_message_._M_dataplus._M_p = (pointer)paVar1;
  if (local_38 == &local_28) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_27,local_28);
    *(undefined8 *)((long)&(this->super_Cryptor).in_message_.field_2 + 8) = uStack_20;
  }
  else {
    (this->super_Cryptor).in_message_._M_dataplus._M_p = local_38;
    (this->super_Cryptor).in_message_.field_2._M_allocated_capacity = CONCAT71(uStack_27,local_28);
  }
  (this->super_Cryptor).in_message_._M_string_length = local_30;
  (this->super_Cryptor).out_message_._M_dataplus._M_p =
       (pointer)&(this->super_Cryptor).out_message_.field_2;
  (this->super_Cryptor).out_message_._M_string_length = 0;
  (this->super_Cryptor).out_message_.field_2._M_local_buf[0] = '\0';
  (this->super_Cryptor)._vptr_Cryptor = (_func_int **)&PTR__HuffmanEncoder_0010fb28;
  (this->nodes_).
  super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->nodes_;
  (this->nodes_).
  super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->nodes_;
  (this->nodes_).
  super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>.
  _M_impl._M_node._M_size = 0;
  (this->temp_code_)._M_dataplus._M_p = (pointer)&(this->temp_code_).field_2;
  (this->temp_code_)._M_string_length = 0;
  (this->temp_code_).field_2._M_local_buf[0] = '\0';
  p_Var2 = &(this->table_)._M_t._M_impl.super__Rb_tree_header;
  (this->table_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->table_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->table_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->table_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->table_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_Cryptor).show_ = true;
  return;
}

Assistant:

explicit HuffmanEncoder(const std::string& message) : Cryptor(message) { set_show(true); }